

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cVertexAttrib64BitTest.cpp
# Opt level: O0

IterateResult __thiscall VertexAttrib64Bit::ApiErrorsTest::iterate(ApiErrorsTest *this)

{
  GLenum GVar1;
  IterateResult IVar2;
  bool local_11;
  ApiErrorsTest *pAStack_10;
  bool result;
  ApiErrorsTest *this_local;
  
  pAStack_10 = this;
  Base::IterateStart(&this->super_Base);
  local_11 = true;
  Base::RequireExtension(&this->super_Base,"GL_ARB_vertex_attrib_64bit");
  (*(this->super_Base).gl.genVertexArrays)(1,&this->m_vertex_array_object_id);
  GVar1 = (*(this->super_Base).gl.getError)();
  glu::checkError(GVar1,"GenVertexArrays",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cVertexAttrib64BitTest.cpp"
                  ,0x170);
  (*(this->super_Base).gl.bindVertexArray)(this->m_vertex_array_object_id);
  GVar1 = (*(this->super_Base).gl.getError)();
  glu::checkError(GVar1,"BindVertexArray",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cVertexAttrib64BitTest.cpp"
                  ,0x173);
  invalidEnum(this,&local_11);
  invalidOperation(this,&local_11);
  invalidValue(this,&local_11);
  IVar2 = Base::IterateStop(&this->super_Base,(bool)(local_11 & 1));
  return IVar2;
}

Assistant:

tcu::TestNode::IterateResult ApiErrorsTest::iterate()
{
	IterateStart();

	bool result = true;

	RequireExtension("GL_ARB_vertex_attrib_64bit");

	gl.genVertexArrays(1, &m_vertex_array_object_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "GenVertexArrays");

	gl.bindVertexArray(m_vertex_array_object_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "BindVertexArray");

	invalidEnum(result);
	invalidOperation(result);
	invalidValue(result);

	/* Done */
	return IterateStop(result);
}